

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::RobustnessTestCase::Params::~Params(Params *this)

{
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Params					(void) {}